

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_complex_div(sexp ctx,sexp a,sexp b)

{
  sexp psVar1;
  sexp imag;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp denom;
  sexp real;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_98;
  sexp local_90;
  sexp_gc_var_t local_88;
  sexp local_78;
  sexp local_70;
  sexp_gc_var_t local_68;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_58.var = &local_98;
  local_88.var = &local_90;
  local_90 = (sexp)0x43e;
  local_48.next = &local_88;
  local_48.var = &local_70;
  local_70 = (sexp)0x43e;
  local_58.next = &local_48;
  local_98 = (sexp)0x43e;
  local_68.next = &local_58;
  local_68.var = &local_78;
  local_78 = (sexp)0x43e;
  local_88.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_48.next;
  (ctx->value).context.saves = local_58.next;
  (ctx->value).context.saves = local_68.next;
  (ctx->value).context.saves = &local_68;
  psVar1 = (b->value).type.name;
  local_78 = sexp_mul(ctx,psVar1,psVar1);
  psVar1 = (b->value).type.cpl;
  local_90 = sexp_mul(ctx,psVar1,psVar1);
  local_78 = sexp_add(ctx,local_78,local_90);
  local_70 = sexp_mul(ctx,(a->value).type.name,(b->value).type.name);
  local_90 = sexp_mul(ctx,(a->value).type.cpl,(b->value).type.cpl);
  local_70 = sexp_add(ctx,local_70,local_90);
  local_70 = sexp_div(ctx,local_70,local_78);
  local_98 = sexp_mul(ctx,(a->value).type.cpl,(b->value).type.name);
  local_90 = sexp_mul(ctx,(a->value).type.name,(b->value).type.cpl);
  local_98 = sexp_sub(ctx,local_98,local_90);
  local_98 = sexp_div(ctx,local_98,local_78);
  local_90 = sexp_make_complex(ctx,local_70,local_98);
  (ctx->value).context.saves = local_88.next;
  psVar1 = sexp_complex_normalize(local_90);
  return psVar1;
}

Assistant:

sexp sexp_complex_div (sexp ctx, sexp a, sexp b) {
  sexp_gc_var4(res, real, imag, denom);
  sexp_gc_preserve4(ctx, res, real, imag, denom);
  /* c^2 + d^2 */
  denom = sexp_mul(ctx, sexp_complex_real(b), sexp_complex_real(b));
  res = sexp_mul(ctx, sexp_complex_imag(b), sexp_complex_imag(b));
  denom = sexp_add(ctx, denom, res);
  /* ac + bd */
  real = sexp_mul(ctx, sexp_complex_real(a), sexp_complex_real(b));
  res = sexp_mul(ctx, sexp_complex_imag(a), sexp_complex_imag(b));
  real = sexp_add(ctx, real, res);
  real = sexp_div(ctx, real, denom);
  /* bc - ad */
  imag = sexp_mul(ctx, sexp_complex_imag(a), sexp_complex_real(b));
  res = sexp_mul(ctx, sexp_complex_real(a), sexp_complex_imag(b));
  imag = sexp_sub(ctx, imag, res);
  imag = sexp_div(ctx, imag, denom);
  res = sexp_make_complex(ctx, real, imag);
  sexp_gc_release4(ctx);
  return sexp_complex_normalize(res);
}